

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

void Curl_cpool_do_locked(Curl_easy *data,connectdata *conn,Curl_cpool_conn_do_cb *cb,void *cbdata)

{
  Curl_share *pCVar1;
  cpool *pcVar2;
  
  if (data == (Curl_easy *)0x0) {
    pcVar2 = (cpool *)0x0;
  }
  else {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      if (data->multi_easy == (Curl_multi *)0x0) {
        pcVar2 = &data->multi->cpool;
        if (data->multi == (Curl_multi *)0x0) {
          pcVar2 = (cpool *)0x0;
        }
      }
      else {
        pcVar2 = &data->multi_easy->cpool;
      }
    }
    else {
      pcVar2 = &pCVar1->cpool;
    }
  }
  if (pcVar2 != (cpool *)0x0) {
    if ((pcVar2->share != (Curl_share *)0x0) && ((pcVar2->share->specifier & 0x20) != 0)) {
      Curl_share_lock(pcVar2->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    pcVar2->field_0x98 = pcVar2->field_0x98 | 1;
    (*cb)(conn,data,cbdata);
    pcVar2->field_0x98 = pcVar2->field_0x98 & 0xfe;
    if ((pcVar2->share != (Curl_share *)0x0) && ((pcVar2->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(pcVar2->idata,CURL_LOCK_DATA_CONNECT);
      return;
    }
    return;
  }
  (*cb)(conn,data,cbdata);
  return;
}

Assistant:

void Curl_cpool_do_locked(struct Curl_easy *data,
                          struct connectdata *conn,
                          Curl_cpool_conn_do_cb *cb, void *cbdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  if(cpool) {
    CPOOL_LOCK(cpool);
    cb(conn, data, cbdata);
    CPOOL_UNLOCK(cpool);
  }
  else
    cb(conn, data, cbdata);
}